

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O3

void __thiscall LinePrinter::LinePrinter(LinePrinter *this)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  long *local_50 [2];
  long local_40 [2];
  
  this->have_blank_line_ = true;
  this->console_locked_ = false;
  (this->line_buffer_)._M_dataplus._M_p = (pointer)&(this->line_buffer_).field_2;
  (this->line_buffer_)._M_string_length = 0;
  (this->line_buffer_).field_2._M_local_buf[0] = '\0';
  (this->output_buffer_)._M_dataplus._M_p = (pointer)&(this->output_buffer_).field_2;
  (this->output_buffer_)._M_string_length = 0;
  (this->output_buffer_).field_2._M_local_buf[0] = '\0';
  pcVar2 = getenv("TERM");
  iVar1 = isatty(1);
  if ((pcVar2 == (char *)0x0) || (iVar1 == 0)) {
    this->smart_terminal_ = false;
    this->supports_color_ = false;
  }
  else {
    local_50[0] = local_40;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar2,pcVar2 + sVar3);
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    bVar4 = iVar1 != 0;
    this->smart_terminal_ = bVar4;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
      bVar4 = this->smart_terminal_;
    }
    this->supports_color_ = bVar4;
    if ((bVar4 & 1U) != 0) {
      return;
    }
  }
  pcVar2 = getenv("CLICOLOR_FORCE");
  if (pcVar2 == (char *)0x0) {
    this->supports_color_ = false;
  }
  else {
    local_50[0] = local_40;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar2,pcVar2 + sVar3);
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    this->supports_color_ = iVar1 != 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return;
}

Assistant:

LinePrinter::LinePrinter() : have_blank_line_(true), console_locked_(false) {
  const char* term = getenv("TERM");
#ifndef _WIN32
  smart_terminal_ = isatty(1) && term && string(term) != "dumb";
#else
  if (term && string(term) == "dumb") {
    smart_terminal_ = false;
  } else {
    console_ = GetStdHandle(STD_OUTPUT_HANDLE);
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    smart_terminal_ = GetConsoleScreenBufferInfo(console_, &csbi);
  }
#endif
  supports_color_ = smart_terminal_;
  if (!supports_color_) {
    const char* clicolor_force = getenv("CLICOLOR_FORCE");
    supports_color_ = clicolor_force && string(clicolor_force) != "0";
  }
#ifdef _WIN32
  // Try enabling ANSI escape sequence support on Windows 10 terminals.
  if (supports_color_) {
    DWORD mode;
    if (GetConsoleMode(console_, &mode)) {
      if (!SetConsoleMode(console_, mode | ENABLE_VIRTUAL_TERMINAL_PROCESSING)) {
        supports_color_ = false;
      }
    }
  }
#endif
}